

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription.cpp
# Opt level: O3

bool miniros::urisEqual(string *uri1,string *uri2)

{
  int iVar1;
  bool bVar2;
  uint32_t port2;
  uint32_t port1;
  string host2;
  string host1;
  uint32_t local_60;
  uint32_t local_5c;
  string local_58;
  string local_38;
  
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_5c = 0;
  local_60 = 0;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  network::splitURI(uri1,&local_38,&local_5c);
  network::splitURI(uri2,&local_58,&local_60);
  if ((local_5c == local_60) && (local_38._M_string_length == local_58._M_string_length)) {
    if (local_38._M_string_length == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp(local_38._M_dataplus._M_p,local_58._M_dataplus._M_p,local_38._M_string_length);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,
                    CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,
                             local_38.field_2._M_local_buf[0]) + 1);
  }
  return bVar2;
}

Assistant:

bool urisEqual(const std::string& uri1, const std::string& uri2)
{
  std::string host1, host2;
  uint32_t port1 = 0, port2 = 0;
  network::splitURI(uri1, host1, port1);
  network::splitURI(uri2, host2, port2);
  return port1 == port2 && host1 == host2;
}